

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringlib.c
# Opt level: O1

stringlib_tokens_t * stringlib_splitTokens(char *str,char chr)

{
  char *pcVar1;
  char cVar2;
  stringlib_tokens_t *psVar3;
  stringlib_tokens_t *psVar4;
  stringlib_tokens_t *psVar5;
  char *pcVar6;
  stringlib_tokens_t *unaff_RBP;
  char *pcVar7;
  char *pcVar8;
  
  cVar2 = *str;
  pcVar7 = str;
  if (cVar2 == '\0') {
    psVar4 = (stringlib_tokens_t *)0x0;
    pcVar8 = str;
  }
  else {
    pcVar6 = str;
    psVar5 = unaff_RBP;
    psVar3 = (stringlib_tokens_t *)0x0;
    pcVar1 = str + 1;
    do {
      pcVar8 = pcVar1;
      unaff_RBP = psVar5;
      psVar4 = psVar3;
      if (cVar2 == chr) {
        unaff_RBP = (stringlib_tokens_t *)malloc(0x18);
        unaff_RBP->next = (s_stringlib_token *)0x0;
        psVar4 = unaff_RBP;
        if (psVar3 != (stringlib_tokens_t *)0x0) {
          psVar5->next = unaff_RBP;
          psVar4 = psVar3;
        }
        unaff_RBP->start = (long)pcVar7 - (long)str;
        unaff_RBP->length = (long)pcVar6 - (long)pcVar7;
        pcVar7 = pcVar8;
      }
      cVar2 = *pcVar8;
      pcVar6 = pcVar6 + 1;
      psVar5 = unaff_RBP;
      psVar3 = psVar4;
      pcVar1 = pcVar8 + 1;
    } while (cVar2 != '\0');
  }
  psVar5 = psVar4;
  if (pcVar8 != str) {
    psVar3 = (stringlib_tokens_t *)malloc(0x18);
    psVar3->next = (s_stringlib_token *)0x0;
    psVar5 = psVar3;
    if (psVar4 != (stringlib_tokens_t *)0x0) {
      unaff_RBP->next = psVar3;
      psVar5 = psVar4;
    }
    psVar3->start = (long)pcVar7 - (long)str;
    psVar3->length = (long)pcVar8 - (long)pcVar7;
  }
  return psVar5;
}

Assistant:

stringlib_tokens_t *stringlib_splitTokens(char *str, char chr) {
	char *lastPos;
	char *newPos;

	stringlib_tokens_t *tokens = NULL;
	stringlib_tokens_t *currentToken;
	stringlib_tokens_t *newToken;

	newPos = str;
	lastPos = str;

	while ( *newPos != '\0' ) {
		if ( *newPos == chr ) {
			newToken = (stringlib_tokens_t *) malloc(sizeof(stringlib_tokens_t));
			newToken->next = NULL;

			if ( tokens == NULL ) {
				tokens = newToken;
				currentToken = newToken;
			} else {
				currentToken->next = newToken;
				currentToken = newToken;
			}

			currentToken->start = ( lastPos - str );
			currentToken->length = ( newPos - lastPos );
			lastPos = newPos + 1;
		}
		newPos++;
	}
	if ( newPos != str ) {
		newToken = (stringlib_tokens_t *) malloc(sizeof(stringlib_tokens_t));
		newToken->next = NULL;

		if ( tokens == NULL ) {
			tokens = newToken;
			currentToken = newToken;
		} else {
			currentToken->next = newToken;
			currentToken = newToken;
		}

		currentToken->start = ( lastPos - str );
		currentToken->length = ( newPos - lastPos );
	}
	return tokens;
}